

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O1

void deqp::egl::getDefaultFilterLists
               (vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                *lists,FilterList *baseFilters)

{
  pointer *ppp_Var1;
  long *plVar2;
  FilterList *pFVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  NamedFilterList filters;
  string name;
  allocator<char> local_139;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *local_f8;
  FilterList *local_f0;
  NamedFilterList local_e8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long local_70;
  long local_68;
  anon_struct_16_2_3c8bed26 *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  ppp_Var1 = (pointer *)
             ((long)&local_e8.super_FilterList.m_rules.
                     super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                     ._M_impl.super__Vector_impl_data + 0x10);
  lVar6 = 0;
  local_f8 = lists;
  local_f0 = baseFilters;
  do {
    local_60 = getDefaultFilterLists::s_colorRules + lVar6;
    local_58 = getDefaultFilterLists::s_colorRules[lVar6].name;
    lVar5 = 0;
    local_70 = lVar6;
    do {
      lVar6 = 0;
      local_68 = lVar5;
      do {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_58,&local_139);
        plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
        local_138 = &local_128;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_128 = *plVar4;
          lStack_120 = plVar2[3];
        }
        else {
          local_128 = *plVar4;
          local_138 = (long *)*plVar2;
        }
        local_130 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_118 = &local_108;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_108 = *plVar4;
          lStack_100 = plVar2[3];
        }
        else {
          local_108 = *plVar4;
          local_118 = (long *)*plVar2;
        }
        local_110 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar4 = plVar2 + 2;
        if ((pointer *)*plVar2 == (pointer *)plVar4) {
          local_e8.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
          local_e8.m_name._M_dataplus._M_p = (pointer)plVar2[3];
          local_e8.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppp_Var1;
        }
        else {
          local_e8.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
          local_e8.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar2;
        }
        local_e8.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_90 = &local_80;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_80 = *plVar4;
          lStack_78 = plVar2[3];
        }
        else {
          local_80 = *plVar4;
          local_90 = (long *)*plVar2;
        }
        local_88 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if ((pointer *)
            local_e8.super_FilterList.m_rules.
            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            ._M_impl.super__Vector_impl_data._M_start != ppp_Var1) {
          operator_delete(local_e8.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.super_FilterList.m_rules.
                                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        NamedFilterList::NamedFilterList
                  (&local_e8,(char *)local_90,glcts::fixed_sample_locations_values + 1);
        pFVar3 = eglu::FilterList::operator<<(&local_e8.super_FilterList,local_f0);
        pFVar3 = eglu::FilterList::operator<<(pFVar3,local_60->filter);
        pFVar3 = eglu::FilterList::operator<<
                           (pFVar3,getDefaultFilterLists::s_depthRules[lVar5].filter);
        pFVar3 = eglu::FilterList::operator<<
                           (pFVar3,*(ConfigFilter *)
                                    ((long)&getDefaultFilterLists::s_stencilRules[0].filter + lVar6)
                           );
        eglu::FilterList::operator<<(pFVar3,isConformant);
        std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::
        push_back(local_f8,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.m_description._M_dataplus._M_p != &local_e8.m_description.field_2) {
          operator_delete(local_e8.m_description._M_dataplus._M_p,
                          local_e8.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
          operator_delete(local_e8.m_name._M_dataplus._M_p,
                          local_e8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_e8.super_FilterList.m_rules.
            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_e8.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.super_FilterList.m_rules.
                                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.super_FilterList.m_rules.
                                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 == 0x10);
      lVar5 = local_68 + 1;
    } while (local_68 == 0);
    lVar6 = local_70 + 1;
  } while (lVar6 != 5);
  NamedFilterList::NamedFilterList(&local_e8,"other","All other configs");
  pFVar3 = eglu::FilterList::operator<<(&local_e8.super_FilterList,local_f0);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<5,6,5,0>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<8,8,8,0>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<4,4,4,4>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<5,5,5,1>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<8,8,8,8>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,isConformant);
  eglu::FilterList::operator<<(pFVar3,notFloat);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::push_back
            (local_f8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_description._M_dataplus._M_p != &local_e8.m_description.field_2) {
    operator_delete(local_e8.m_description._M_dataplus._M_p,
                    local_e8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
    operator_delete(local_e8.m_name._M_dataplus._M_p,
                    local_e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_e8.super_FilterList.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_e8.super_FilterList.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getDefaultFilterLists (vector<NamedFilterList>& lists, const FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0> },
		{ "rgb888",		colorBits<8, 8, 8, 0> },
		{ "rgba4444",	colorBits<4, 4, 4, 4> },
		{ "rgba5551",	colorBits<5, 5, 5, 1> },
		{ "rgba8888",	colorBits<8, 8, 8, 8> }
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_depthRules[] =
	{
		{ "no_depth",	noDepth		},
		{ "depth",		hasDepth	},
	};

	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_stencilRules[] =
	{
		{ "no_stencil",	noStencil	},
		{ "stencil",	hasStencil	},
	};

	for (int colorRuleNdx = 0; colorRuleNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorRuleNdx++)
	{
		for (int depthRuleNdx = 0; depthRuleNdx < DE_LENGTH_OF_ARRAY(s_depthRules); depthRuleNdx++)
		{
			for (int stencilRuleNdx = 0; stencilRuleNdx < DE_LENGTH_OF_ARRAY(s_stencilRules); stencilRuleNdx++)
			{
				const string		name		= string(s_colorRules[colorRuleNdx].name) + "_" + s_depthRules[depthRuleNdx].name + "_" + s_stencilRules[stencilRuleNdx].name;
				NamedFilterList		filters		(name.c_str(), "");

				filters << baseFilters
						<< s_colorRules[colorRuleNdx].filter
						<< s_depthRules[depthRuleNdx].filter
						<< s_stencilRules[stencilRuleNdx].filter
						<< isConformant;

				lists.push_back(filters);
			}
		}
	}

	// Build "other" set - not configs that don't match any of known color rules
	{
		NamedFilterList		filters		("other", "All other configs");

		// \todo [2014-12-18 pyry] Optimize rules
		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		lists.push_back(filters);
	}
}